

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::AdditionalCleanFiles(cmLocalNinjaGenerator *this)

{
  cmMakefile *pcVar1;
  cmGlobalNinjaGenerator *this_00;
  char *pcVar2;
  string *psVar3;
  string *in_base;
  string *in_path;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  cmGeneratorExpression ge;
  allocator<char> local_d1;
  undefined1 local_d0 [16];
  string *psStack_c0;
  undefined8 local_b8;
  cmGeneratorExpression local_a8;
  string local_98;
  cmListFileBacktrace local_78;
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&local_68);
  pcVar2 = cmMakefile::GetProperty(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (pcVar2 != (char *)0x0) {
    local_b8 = 0;
    local_d0._8_8_ = (string *)0x0;
    psStack_c0 = (string *)0x0;
    local_78.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&local_a8,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_d0,(char *)&local_a8);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_BUILD_TYPE",&local_d1);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_d0._0_8_,(cmLocalGenerator *)this,
                        psVar3,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_68);
    cmSystemTools::ExpandListArgument
              (psVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_d0 + 8),false);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_98);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_d0);
    cmGeneratorExpression::~cmGeneratorExpression(&local_a8);
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    psVar3 = psStack_c0;
    this_00 = (cmGlobalNinjaGenerator *)
              (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    for (in_path = (string *)local_d0._8_8_; in_path != psVar3; in_path = in_path + 1) {
      cmsys::SystemTools::CollapseFullPath(&local_48,in_path,in_base);
      cmGlobalNinjaGenerator::AddAdditionalCleanFile(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_d0 + 8));
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AdditionalCleanFiles()
{
  if (const char* prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> cleanFiles;
    {
      cmGeneratorExpression ge;
      auto cge = ge.Parse(prop_value);
      cmSystemTools::ExpandListArgument(
        cge->Evaluate(this,
                      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
        cleanFiles);
    }
    std::string const& binaryDir = this->GetCurrentBinaryDirectory();
    cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
    for (std::string const& cleanFile : cleanFiles) {
      // Support relative paths
      gg->AddAdditionalCleanFile(
        cmSystemTools::CollapseFullPath(cleanFile, binaryDir));
    }
  }
}